

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenerContainerTest.cpp
# Opt level: O0

int main(void)

{
  Foo *this;
  Cat *this_00;
  int local_64;
  int local_60;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Foo *foo;
  Cat *kittens [4];
  
  this = (Foo *)operator_new(8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/listenerContainerTest.cpp"
                             ,0x83);
  Foo::Foo(this);
  for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
    this_00 = (Cat *)operator_new(0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/listenerContainerTest.cpp"
                                  ,0x87);
    Cat::Cat(this_00,i_2);
    kittens[(long)i_2 + -1] = this_00;
    Foo::addListener(this,&kittens[(long)i_2 + -1]->super_FooListener);
  }
  getchar();
  for (i_3 = 10; i_3 < 0xe; i_3 = i_3 + 1) {
    Foo::DoFoo(this,i_3);
  }
  getchar();
  for (i_4 = 0; i_4 < 2; i_4 = i_4 + 1) {
  }
  Foo::DoBar(this);
  for (i_5 = 0; i_5 < 4; i_5 = i_5 + 1) {
    if (i_5 % 2 == 0) {
      Foo::removeListener(this,&kittens[(long)i_5 + -1]->super_FooListener);
    }
  }
  getchar();
  for (local_60 = 10; local_60 < 0xb; local_60 = local_60 + 1) {
    Foo::DoFoo(this,local_60);
  }
  getchar();
  for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
  }
  Foo::DoBar(this);
  return 0;
}

Assistant:

int main()
{
	Cat *kittens[4];
	Foo *foo = jh_new Foo();
	
	for (int i = 0; i < 4; ++i)
	{
		kittens[i] = jh_new Cat(i);
		foo->addListener(kittens[i]);
	}
	
	LOG_NOTICE("Try some foo");
	getchar();
	
	for (int i = 10; i < 14; ++i)
		foo->DoFoo(i);
	
	LOG_NOTICE("Try some bar");
	getchar();
	
	for (int i = 0; i < 2; ++i);
		foo->DoBar();

	LOG_NOTICE("Remove some listeners");
	for (int i = 0; i < 4; ++i)
	{
		if (i%2 == 0)
			foo->removeListener(kittens[i]);
	}
	
	LOG_NOTICE("Try some foo");
	getchar();
	
	for (int i = 10; i < 11; ++i)
		foo->DoFoo(i);
	
	LOG_NOTICE("Try some bar");
	getchar();
	
	for (int i = 0; i < 2; ++i);
		foo->DoBar();
}